

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void shift_copy(uint8_t *src,uint8_t *dst,int shift,int width)

{
  byte bVar1;
  ulong __n;
  
  if (shift < 0) {
    __n = (ulong)(uint)-shift;
    memcpy(dst,src + __n,(long)(shift + 0x40));
    dst = dst + (0x40 - __n);
    bVar1 = src[0x3f];
  }
  else {
    __n = (ulong)(uint)shift;
    memcpy(dst + __n,src,(long)(0x40 - shift));
    bVar1 = *src;
  }
  memset(dst,(uint)bVar1,__n);
  return;
}

Assistant:

static inline void shift_copy(const uint8_t *src, uint8_t *dst, int shift,
                              int width) {
  if (shift >= 0) {
    memcpy(dst + shift, src, width - shift);
    memset(dst, src[0], shift);
  } else {
    shift = -shift;
    memcpy(dst, src + shift, width - shift);
    memset(dst + width - shift, src[width - 1], shift);
  }
}